

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

json * __thiscall
cfd::js::api::json::
ExecuteJsonApi<cfd::js::api::json::CreateExtkeyFromParentRequest,cfd::js::api::json::CreateExtkeyResponse,cfd::js::api::CreateExtkeyFromParentRequestStruct,cfd::js::api::CreateExtkeyResponseStruct>
          (json *this,string *request_message,
          function<cfd::js::api::CreateExtkeyResponseStruct_(const_cfd::js::api::CreateExtkeyFromParentRequestStruct_&)>
          *call_function)

{
  ErrorResponse local_560;
  JsonClassBase<cfd::js::api::json::ErrorResponseBase> local_4a8 [4];
  JsonClassBase<cfd::js::api::json::CreateExtkeyResponse> local_488 [4];
  undefined1 local_468 [8];
  CreateExtkeyResponse res_2;
  undefined1 local_408 [8];
  CreateExtkeyResponseStruct response;
  CreateExtkeyFromParentRequestStruct request;
  ErrorResponse res_1;
  CfdException *cfd_except;
  ErrorResponse res;
  CfdException ex;
  undefined1 local_c0 [8];
  CreateExtkeyFromParentRequest req;
  function<cfd::js::api::CreateExtkeyResponseStruct_(const_cfd::js::api::CreateExtkeyFromParentRequestStruct_&)>
  *call_function_local;
  string *request_message_local;
  string *json_message;
  
  req._152_8_ = call_function;
  CreateExtkeyFromParentRequest::CreateExtkeyFromParentRequest
            ((CreateExtkeyFromParentRequest *)local_c0);
  core::JsonClassBase<cfd::js::api::json::CreateExtkeyFromParentRequest>::Deserialize
            ((JsonClassBase<cfd::js::api::json::CreateExtkeyFromParentRequest> *)local_c0,
             request_message);
  CreateExtkeyFromParentRequest::ConvertToStruct
            ((CreateExtkeyFromParentRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (CreateExtkeyFromParentRequest *)local_c0);
  std::
  function<cfd::js::api::CreateExtkeyResponseStruct_(const_cfd::js::api::CreateExtkeyFromParentRequestStruct_&)>
  ::operator()((CreateExtkeyResponseStruct *)local_408,call_function,
               (CreateExtkeyFromParentRequestStruct *)
               &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  res_2._87_1_ = 0;
  std::__cxx11::string::string((string *)this);
  if (response._24_4_ == 0) {
    CreateExtkeyResponse::CreateExtkeyResponse((CreateExtkeyResponse *)local_468);
    CreateExtkeyResponse::ConvertFromStruct
              ((CreateExtkeyResponse *)local_468,(CreateExtkeyResponseStruct *)local_408);
    core::JsonClassBase<cfd::js::api::json::CreateExtkeyResponse>::Serialize_abi_cxx11_(local_488);
    std::__cxx11::string::operator=((string *)this,(string *)local_488);
    std::__cxx11::string::~string((string *)local_488);
    CreateExtkeyResponse::~CreateExtkeyResponse((CreateExtkeyResponse *)local_468);
  }
  else {
    ErrorResponse::ConvertFromStruct(&local_560,(InnerErrorResponseStruct *)&response.field_0x18);
    core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_(local_4a8);
    std::__cxx11::string::operator=((string *)this,(string *)local_4a8);
    std::__cxx11::string::~string((string *)local_4a8);
    ErrorResponse::~ErrorResponse(&local_560);
  }
  res_2._87_1_ = 1;
  CreateExtkeyResponseStruct::~CreateExtkeyResponseStruct((CreateExtkeyResponseStruct *)local_408);
  CreateExtkeyFromParentRequestStruct::~CreateExtkeyFromParentRequestStruct
            ((CreateExtkeyFromParentRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  CreateExtkeyFromParentRequest::~CreateExtkeyFromParentRequest
            ((CreateExtkeyFromParentRequest *)local_c0);
  return this;
}

Assistant:

std::string ExecuteJsonApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        call_function) {
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response = call_function(request);
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}